

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

FILE * openFile(wstring *fileName,OpenFileMode mode)

{
  char *pcVar1;
  wstring local_40 [8];
  string nameUtf8;
  OpenFileMode mode_local;
  wstring *fileName_local;
  
  convertWStringToUtf8(local_40);
  if (mode == ReadBinary) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    fileName_local = (wstring *)fopen(pcVar1,"rb");
  }
  else if (mode == WriteBinary) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    fileName_local = (wstring *)fopen(pcVar1,"wb");
  }
  else if (mode == ReadWriteBinary) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    fileName_local = (wstring *)fopen(pcVar1,"rb+");
  }
  else {
    fileName_local = (wstring *)0x0;
  }
  std::__cxx11::string::~string((string *)local_40);
  return (FILE *)fileName_local;
}

Assistant:

FILE* openFile(const std::wstring& fileName, OpenFileMode mode)
{
#ifdef _WIN32
	switch (mode)
	{
	case OpenFileMode::ReadBinary:
		return _wfopen(fileName.c_str(),L"rb");
	case OpenFileMode::WriteBinary:
		return _wfopen(fileName.c_str(),L"wb");
	case OpenFileMode::ReadWriteBinary:
		return _wfopen(fileName.c_str(),L"rb+");
	}
#else
	std::string nameUtf8 = convertWStringToUtf8(fileName);
	
	switch (mode)
	{
	case OpenFileMode::ReadBinary:
		return fopen(nameUtf8.c_str(),"rb");
	case OpenFileMode::WriteBinary:
		return fopen(nameUtf8.c_str(),"wb");
	case OpenFileMode::ReadWriteBinary:
		return fopen(nameUtf8.c_str(),"rb+");
	}
#endif

	return NULL;
}